

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastBR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  SerialArena *this;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_00;
  uchar uVar4;
  bool bVar5;
  uchar uVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint32_t size_00;
  uint uVar9;
  char *pcVar10;
  atomic<unsigned_long> *paVar11;
  __pointer_type this_02;
  string *psVar12;
  uint *puVar13;
  ulong uVar14;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  byte local_341;
  byte local_321;
  bool local_2d9;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_280;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_278;
  pointer local_270;
  string *str_1;
  SerialArena *local_260;
  SerialArena *serial_arena;
  Arena *arena;
  anon_class_24_3_e6152a34 validate_last_string;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_228;
  uchar expected_tag;
  uint64_t local_220;
  TcParseTableBase *local_218;
  ParseContext *local_210;
  char *local_208;
  MessageLite *local_200;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1f8;
  TcFieldData local_1f0;
  TcFieldData local_1e8;
  undefined1 local_1d9;
  uint64_t uStack_1d8;
  bool always_return;
  TcParseTableBase *local_1d0;
  ParseContext *local_1c8;
  char *local_1c0;
  MessageLite *local_1b8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1b0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1a0;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  string *str;
  int size;
  char *local_88;
  char *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  void *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  __int_type_conflict local_60;
  size_t unused_bytes;
  SerialArena *local_50;
  char local_41;
  __int_type_conflict local_40;
  memory_order local_38;
  int local_34;
  memory_order __b;
  __int_type_conflict local_28;
  memory_order local_20;
  int local_1c;
  memory_order __b_1;
  atomic<unsigned_long> *local_10;
  
  local_220 = hasbits;
  local_218 = table;
  local_210 = ctx;
  local_208 = ptr;
  local_200 = msg;
  local_1f8 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_1f8);
  pMVar2 = local_200;
  pcVar10 = local_208;
  pPVar1 = local_210;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffdd8);
    pcVar10 = MiniParse(pMVar2,pcVar10,pPVar1,(TcFieldData)aStack_228,local_218,local_220);
    return pcVar10;
  }
  uVar4 = UnalignedLoad<unsigned_char>(local_208);
  pMVar2 = local_200;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_1f8);
  validate_last_string.table =
       (TcParseTableBase *)
       RefAt<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(pMVar2,(ulong)uVar7);
  validate_last_string._0_8_ = local_218;
  arena._0_1_ = uVar4;
  validate_last_string.field =
       (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)validate_last_string.table;
  serial_arena = (SerialArena *)
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::GetArena((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)validate_last_string.table);
  local_2d9 = false;
  if ((ThreadSafeArena *)serial_arena != (ThreadSafeArena *)0x0) {
    bVar5 = ThreadSafeArena::GetSerialArenaFast((ThreadSafeArena *)serial_arena,&local_260);
    local_2d9 = false;
    if (bVar5) {
      local_2d9 = RepeatedPtrFieldBase::PrepareForParse
                            (&(validate_last_string.field)->super_RepeatedPtrFieldBase);
    }
  }
  if (local_2d9 == false) {
    do {
      local_208 = local_208 + 1;
      local_270 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Add(validate_last_string.field);
      local_208 = InlineGreedyStringParser(local_270,local_208,local_210);
      local_341 = 1;
      if (local_208 != (char *)0x0) {
        bVar5 = RepeatedString<unsigned_char,_google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(google::protobuf::internal::TcParser::Utf8Type)0>
                ::anon_class_24_3_e6152a34::operator()((anon_class_24_3_e6152a34 *)&arena);
        local_341 = bVar5 ^ 0xff;
      }
      pMVar2 = local_200;
      pcVar10 = local_208;
      pPVar1 = local_210;
      if ((local_341 & 1) != 0) {
        TcFieldData::TcFieldData((TcFieldData *)&local_278);
        pcVar10 = Error(pMVar2,pcVar10,pPVar1,(TcFieldData)local_278,local_218,local_220);
        return pcVar10;
      }
      bVar5 = EpsCopyInputStream::DataAvailable(&local_210->super_EpsCopyInputStream,local_208);
      if (((bVar5 ^ 0xffU) & 1) != 0) {
LAB_001a3ec0:
        pMVar2 = local_200;
        pcVar10 = local_208;
        TcFieldData::TcFieldData(&data_local);
        if (local_218->has_bits_offset != 0) {
          uVar9 = (uint)local_220;
          puVar13 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_218->has_bits_offset);
          *puVar13 = uVar9 | *puVar13;
        }
        return pcVar10;
      }
      uVar6 = UnalignedLoad<unsigned_char>(local_208);
    } while (uVar6 == uVar4);
  }
  else {
    do {
      pPVar1 = local_210;
      this_00 = validate_last_string.field;
      this = local_260;
      local_208 = local_208 + 1;
      local_88 = local_208;
      size_00 = ReadSize(&local_88);
      if (local_88 == (char *)0x0) {
        local_80 = (char *)0x0;
        pcVar10 = local_80;
      }
      else {
        p = this;
        local_50 = this;
        unused_bytes = (size_t)&local_78;
        paVar11 = &this->string_block_unused_;
        local_34 = 0;
        ___b = paVar11;
        local_38 = std::operator&(memory_order_relaxed,__memory_order_mask);
        if (local_34 - 1U < 2) {
          local_40 = (paVar11->super___atomic_base<unsigned_long>)._M_i;
        }
        else if (local_34 == 5) {
          local_40 = (paVar11->super___atomic_base<unsigned_long>)._M_i;
        }
        else {
          local_40 = (paVar11->super___atomic_base<unsigned_long>)._M_i;
        }
        local_60 = local_40;
        if (local_40 == 0) {
          local_41 = '\0';
        }
        else {
          local_60 = local_40 - 0x20;
          paVar11 = &this->string_block_unused_;
          local_1c = 0;
          ___b_1 = local_60;
          local_10 = paVar11;
          local_20 = std::operator&(memory_order_relaxed,__memory_order_mask);
          local_28 = ___b_1;
          if (local_1c == 3) {
            (paVar11->super___atomic_base<unsigned_long>)._M_i = ___b_1;
          }
          else if (local_1c == 5) {
            LOCK();
            (paVar11->super___atomic_base<unsigned_long>)._M_i = ___b_1;
            UNLOCK();
          }
          else {
            (paVar11->super___atomic_base<unsigned_long>)._M_i = ___b_1;
          }
          this_02 = std::atomic<google::protobuf::internal::StringBlock_*>::load
                              (&this->string_block_,memory_order_relaxed);
          psVar12 = StringBlock::AtOffset_abi_cxx11_(this_02,local_60);
          *(string **)unused_bytes = psVar12;
          local_41 = '\x01';
        }
        if (local_41 == '\0') {
          local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     SerialArena::AllocateFromStringBlockFallback(this);
        }
        else {
          local_68 = local_78;
        }
        p_00 = local_68;
        std::__cxx11::string::string((string *)local_68);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::AddAllocatedForParse(this_00,p_00);
        local_88 = EpsCopyInputStream::ReadString
                             (&pPVar1->super_EpsCopyInputStream,local_88,size_00,p_00);
        if (local_88 == (char *)0x0) {
          local_80 = (char *)0x0;
          pcVar10 = local_80;
        }
        else {
          pcVar10 = local_88;
          if (local_88 == (char *)0x0) {
            protobuf_assumption_failed
                      ("ptr != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x8b2);
          }
        }
      }
      local_80 = pcVar10;
      local_208 = local_80;
      local_321 = 1;
      if (local_80 != (char *)0x0) {
        bVar5 = RepeatedString<unsigned_char,_google::protobuf::RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(google::protobuf::internal::TcParser::Utf8Type)0>
                ::anon_class_24_3_e6152a34::operator()((anon_class_24_3_e6152a34 *)&arena);
        local_321 = bVar5 ^ 0xff;
      }
      pMVar2 = local_200;
      pcVar10 = local_208;
      pPVar1 = local_210;
      if ((local_321 & 1) != 0) {
        TcFieldData::TcFieldData((TcFieldData *)&str_1);
        pcVar10 = Error(pMVar2,pcVar10,pPVar1,(TcFieldData)str_1,local_218,local_220);
        return pcVar10;
      }
      bVar5 = EpsCopyInputStream::DataAvailable(&local_210->super_EpsCopyInputStream,local_208);
      if (((bVar5 ^ 0xffU) & 1) != 0) goto LAB_001a3ec0;
      uVar6 = UnalignedLoad<unsigned_char>(local_208);
    } while (uVar6 == uVar4);
  }
  pMVar2 = local_200;
  pcVar10 = local_208;
  pPVar1 = local_210;
  TcFieldData::TcFieldData((TcFieldData *)&local_280);
  local_1b0 = local_280;
  local_1b8 = pMVar2;
  local_1c0 = pcVar10;
  local_1c8 = pPVar1;
  local_1d0 = local_218;
  uStack_1d8 = local_220;
  local_1d9 = 0;
  bVar5 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar10);
  pMVar2 = local_1b8;
  pcVar10 = local_1c0;
  pPVar1 = local_1c8;
  if (!bVar5) {
    TcFieldData::TcFieldData(&local_1e8);
    if (local_1d0->has_bits_offset != 0) {
      uVar9 = (uint)uStack_1d8;
      puVar13 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_1d0->has_bits_offset);
      *puVar13 = uVar9 | *puVar13;
    }
    return pcVar10;
  }
  TcFieldData::TcFieldData(&local_1f0);
  this_01 = local_1d0;
  uVar3 = uStack_1d8;
  uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
  uVar14 = (ulong)(int)((uint)uVar8 & (uint)this_01->fast_idx_mask);
  if ((uVar14 & 7) == 0) {
    data_1.field_0 =
         (anon_union_8_1_898a9ca8_for_TcFieldData_0)
         TcParseTableBase::fast_entry(this_01,uVar14 >> 3);
    local_1a0.data =
         ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
         (ulong)uVar8;
    UNRECOVERED_JUMPTABLE =
         TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
    local_1a8.data = local_1a0.data;
    pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar10,pPVar1,(TcFieldData)local_1a0,this_01,uVar3);
    return pcVar10;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x44d);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastBR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint8_t, RepeatedPtrField<std::string>, kNoUtf8>(PROTOBUF_TC_PARAM_PASS);
}